

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O0

void __thiscall xercesc_4_0::XMLUri::XMLUri(XMLUri *this,XMLUri *toCopy)

{
  OutOfMemoryException *anon_var_0;
  undefined1 local_30 [8];
  CleanupType_conflict5 cleanup;
  XMLUri *toCopy_local;
  XMLUri *this_local;
  
  cleanup._16_8_ = toCopy;
  XSerializable::XSerializable(&this->super_XSerializable,&toCopy->super_XSerializable);
  (this->super_XSerializable)._vptr_XSerializable = (_func_int **)&PTR__XMLUri_00526bf8;
  this->fPort = -1;
  this->fScheme = (XMLCh *)0x0;
  this->fUserInfo = (XMLCh *)0x0;
  this->fHost = (XMLCh *)0x0;
  this->fRegAuth = (XMLCh *)0x0;
  this->fPath = (XMLCh *)0x0;
  this->fQueryString = (XMLCh *)0x0;
  this->fFragment = (XMLCh *)0x0;
  this->fURIText = (XMLCh *)0x0;
  this->fMemoryManager = *(MemoryManager **)(cleanup._16_8_ + 0x50);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30,this,(MFPT)cleanUp);
  initialize(this,(XMLUri *)cleanup._16_8_);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::release
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30);
  JanitorMemFunCall<xercesc_4_0::XMLUri>::~JanitorMemFunCall
            ((JanitorMemFunCall<xercesc_4_0::XMLUri> *)local_30);
  return;
}

Assistant:

XMLUri::XMLUri(const XMLUri& toCopy)
: XSerializable(toCopy)
, XMemory(toCopy)
, fPort(-1)
, fScheme(0)
, fUserInfo(0)
, fHost(0)
, fRegAuth(0)
, fPath(0)
, fQueryString(0)
, fFragment(0)
, fURIText(0)
, fMemoryManager(toCopy.fMemoryManager)
{
    CleanupType cleanup(this, &XMLUri::cleanUp);

    try {
        initialize(toCopy);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}